

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

string * cmExportFileGeneratorEscape(string *__return_storage_ptr__,string *str)

{
  WrapQuotes in_R8D;
  undefined1 auVar1 [16];
  string_view str_00;
  string *str_local;
  string *result;
  
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)str);
  str_00._M_len = auVar1._8_8_;
  str_00._M_str = (char *)0x0;
  cmOutputConverter::EscapeForCMake_abi_cxx11_(__return_storage_ptr__,auVar1._0_8_,str_00,in_R8D);
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"\\${_IMPORT_PREFIX}","${_IMPORT_PREFIX}");
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"\\${CMAKE_IMPORT_LIBRARY_SUFFIX}",
             "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
  return __return_storage_ptr__;
}

Assistant:

static std::string cmExportFileGeneratorEscape(std::string const& str)
{
  // Escape a property value for writing into a .cmake file.
  std::string result = cmOutputConverter::EscapeForCMake(str);
  // Un-escape variable references generated by our own export code.
  cmSystemTools::ReplaceString(result, "\\${_IMPORT_PREFIX}",
                               "${_IMPORT_PREFIX}");
  cmSystemTools::ReplaceString(result, "\\${CMAKE_IMPORT_LIBRARY_SUFFIX}",
                               "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
  return result;
}